

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

time_t mktime_string(string *s)

{
  int iVar1;
  size_type sVar2;
  tm gbuf;
  smatch mTm;
  size_t *in_stack_fffffffffffffe88;
  tm *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  match_flag_type in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__s;
  string local_148 [12];
  flag_type in_stack_fffffffffffffec4;
  char *in_stack_fffffffffffffec8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffed0;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  time_t local_8;
  
  if (mktime_string(std::__cxx11::string_const&)::reTm_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&mktime_string(std::__cxx11::string_const&)::reTm_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &mktime_string(std::__cxx11::string_const&)::reTm_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&mktime_string(std::__cxx11::string_const&)::reTm_abi_cxx11_);
    }
  }
  __s = &local_40;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)in_stack_fffffffffffffe90);
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (__s,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_stack_fffffffffffffe9c
            );
  sVar2 = std::__cxx11::
          match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::size((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_fffffffffffffe90);
  if (sVar2 == 7) {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_58 = 0;
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
          (size_type)in_stack_fffffffffffffe90);
    iVar1 = std::__cxx11::stoi((string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
    local_78._4_4_ = iVar1 + -0x76c;
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
          (size_type)in_stack_fffffffffffffe90);
    iVar1 = std::__cxx11::stoi((string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
    local_78 = CONCAT44(local_78._4_4_,iVar1 + -1);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
          (size_type)in_stack_fffffffffffffe90);
    iVar1 = std::__cxx11::stoi((string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
    uStack_80._4_4_ = iVar1;
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
          (size_type)in_stack_fffffffffffffe90);
    iVar1 = std::__cxx11::stoi((string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
    uStack_80 = CONCAT44(uStack_80._4_4_,iVar1);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
          (size_type)in_stack_fffffffffffffe90);
    iVar1 = std::__cxx11::stoi((string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
    local_88._4_4_ = iVar1;
    std::__cxx11::string::~string(local_128);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *)CONCAT44(iVar1,in_stack_fffffffffffffe98),(size_type)in_stack_fffffffffffffe90);
    iVar1 = std::__cxx11::stoi((string *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,0);
    local_88 = CONCAT44(local_88._4_4_,iVar1);
    std::__cxx11::string::~string(local_148);
    local_68 = CONCAT44(local_68._4_4_,0xffffffff);
    local_8 = mktime_utc(in_stack_fffffffffffffe90);
  }
  else {
    local_8 = 0;
  }
  local_44 = 1;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)0x201ae0);
  return local_8;
}

Assistant:

time_t mktime_string (const std::string& s)
{
    static std::regex reTm ("(\\d{4})-(\\d{2})-(\\d{2}) (\\d{1,2}):(\\d{2}):(\\d{2})");
    std::smatch mTm;
    std::regex_search(s, mTm, reTm);
    if (mTm.size() != 7)
        return 0;
        
    struct tm gbuf;
    memset(&gbuf, 0, sizeof(gbuf));
    gbuf.tm_year = std::stoi(mTm.str(1)) - 1900;
    gbuf.tm_mon  = std::stoi(mTm.str(2)) -    1;
    gbuf.tm_mday = std::stoi(mTm.str(3));
    gbuf.tm_hour = std::stoi(mTm.str(4));
    gbuf.tm_min  = std::stoi(mTm.str(5));
    gbuf.tm_sec  = std::stoi(mTm.str(6));
    gbuf.tm_isdst = -1;         // re-lookup timezone/DST information!
    return mktime_utc(gbuf);
}